

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.c
# Opt level: O0

int nonblankrange(char *str,int start,int len)

{
  ushort **ppuVar1;
  int local_24;
  int i;
  int len_local;
  int start_local;
  char *str_local;
  
  _len_local = str;
  for (local_24 = 0; local_24 < start; local_24 = local_24 + 1) {
    if (*_len_local == '\0') {
      return 0;
    }
    _len_local = _len_local + 1;
  }
  local_24 = 0;
  for (; (local_24 < len && (*_len_local != '\0')); _len_local = _len_local + 1) {
    ppuVar1 = __ctype_b_loc();
    if (((*ppuVar1)[(int)*_len_local] & 0x2000) == 0) {
      return 1;
    }
    local_24 = local_24 + 1;
  }
  return 0;
}

Assistant:

int nonblankrange(char *str, int start, int len) {
   register int i;

   for(i = 0; i < start; i++) {
      if (*str++ == '\0')   { return 0; }
   }
   for(i = 0; i < len; i++) {
      if (*str == '\0')     { break; }
      if (! isspace(*str))  { return 1; }
      str++;
   }
   return 0;
}